

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# login_message_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::LoginMessageTest_test_encode_and_decode_Test::TestBody
          (LoginMessageTest_test_encode_and_decode_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_bd0;
  Message local_bc8;
  pixie local_bc0 [296];
  undefined1 local_a98 [8];
  AssertionResult gtest_ar_3;
  Message local_a80;
  pixie local_a78 [296];
  undefined1 local_950 [8];
  AssertionResult gtest_ar_2;
  Message local_938;
  pixie local_930 [296];
  undefined1 local_808 [8];
  AssertionResult gtest_ar_1;
  string local_7d8 [32];
  string local_7b8 [32];
  string local_798 [32];
  string local_778 [39];
  allocator<char> local_751;
  string local_750 [32];
  string local_730 [32];
  string local_710 [32];
  LoginMessage local_6f0 [8];
  LoginMessage message3;
  string local_5c8 [32];
  string local_5a8 [32];
  string local_588 [32];
  string local_568 [32];
  string local_548 [32];
  string local_528 [39];
  allocator<char> local_501;
  string local_500 [32];
  string local_4e0 [32];
  LoginMessage local_4c0 [8];
  LoginMessage message2;
  string local_398 [32];
  string local_378 [32];
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [39];
  allocator<char> local_2b1;
  string local_2b0 [32];
  LoginMessage local_290 [8];
  LoginMessage message1;
  AssertHelper local_168;
  Message local_160 [3];
  pixie local_148 [296];
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  LoginMessageTest_test_encode_and_decode_Test *this_local;
  
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  EncodeAndDecode(local_148,(LoginMessage *)login_message);
  testing::internal::EqHelper<false>::
  Compare<bidfx_public_api::price::pixie::LoginMessage,bidfx_public_api::price::pixie::LoginMessage>
            ((EqHelper<false> *)local_20,"login_message","EncodeAndDecode(login_message)",
             (LoginMessage *)login_message,(LoginMessage *)local_148);
  LoginMessage::~LoginMessage((LoginMessage *)local_148);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_160);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/login_message_test.cpp"
               ,0x80,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    testing::Message::~Message(local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2b0,"mcandate",&local_2b1);
  std::__cxx11::string::string(local_2d8,(string *)PASSWORD_abi_cxx11_);
  std::__cxx11::string::string(local_2f8,(string *)ALIAS_abi_cxx11_);
  std::__cxx11::string::string(local_318,(string *)APPLICATION_abi_cxx11_);
  std::__cxx11::string::string(local_338,(string *)APPLICATION_VERSION_abi_cxx11_);
  std::__cxx11::string::string(local_358,(string *)API_abi_cxx11_);
  std::__cxx11::string::string(local_378,(string *)API_VERSION_abi_cxx11_);
  std::__cxx11::string::string(local_398,(string *)PRODUCT_SERIAL_NUMBER_abi_cxx11_);
  bidfx_public_api::price::pixie::LoginMessage::LoginMessage
            (local_290,local_2b0,local_2d8,local_2f8,local_318,local_338,local_358,local_378,
             local_398);
  std::__cxx11::string::~string(local_398);
  std::__cxx11::string::~string(local_378);
  std::__cxx11::string::~string(local_358);
  std::__cxx11::string::~string(local_338);
  std::__cxx11::string::~string(local_318);
  std::__cxx11::string::~string(local_2f8);
  std::__cxx11::string::~string(local_2d8);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  std::__cxx11::string::string(local_4e0,(string *)USERNAME_abi_cxx11_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_500,"g1veMes0Mehoney",&local_501);
  std::__cxx11::string::string(local_528,(string *)ALIAS_abi_cxx11_);
  std::__cxx11::string::string(local_548,(string *)APPLICATION_abi_cxx11_);
  std::__cxx11::string::string(local_568,(string *)APPLICATION_VERSION_abi_cxx11_);
  std::__cxx11::string::string(local_588,(string *)API_abi_cxx11_);
  std::__cxx11::string::string(local_5a8,(string *)API_VERSION_abi_cxx11_);
  std::__cxx11::string::string(local_5c8,(string *)PRODUCT_SERIAL_NUMBER_abi_cxx11_);
  bidfx_public_api::price::pixie::LoginMessage::LoginMessage
            (local_4c0,local_4e0,local_500,local_528,local_548,local_568,local_588,local_5a8,
             local_5c8);
  std::__cxx11::string::~string(local_5c8);
  std::__cxx11::string::~string(local_5a8);
  std::__cxx11::string::~string(local_588);
  std::__cxx11::string::~string(local_568);
  std::__cxx11::string::~string(local_548);
  std::__cxx11::string::~string(local_528);
  std::__cxx11::string::~string(local_500);
  std::allocator<char>::~allocator(&local_501);
  std::__cxx11::string::~string(local_4e0);
  std::__cxx11::string::string(local_710,(string *)USERNAME_abi_cxx11_);
  std::__cxx11::string::string(local_730,(string *)PASSWORD_abi_cxx11_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_750,"matteo",&local_751);
  std::__cxx11::string::string(local_778,(string *)APPLICATION_abi_cxx11_);
  std::__cxx11::string::string(local_798,(string *)APPLICATION_VERSION_abi_cxx11_);
  std::__cxx11::string::string(local_7b8,(string *)API_abi_cxx11_);
  std::__cxx11::string::string(local_7d8,(string *)API_VERSION_abi_cxx11_);
  std::__cxx11::string::string
            ((string *)&gtest_ar_1.message_,(string *)PRODUCT_SERIAL_NUMBER_abi_cxx11_);
  bidfx_public_api::price::pixie::LoginMessage::LoginMessage
            (local_6f0,local_710,local_730,local_750,local_778,local_798,local_7b8,local_7d8,
             &gtest_ar_1.message_);
  std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
  std::__cxx11::string::~string(local_7d8);
  std::__cxx11::string::~string(local_7b8);
  std::__cxx11::string::~string(local_798);
  std::__cxx11::string::~string(local_778);
  std::__cxx11::string::~string(local_750);
  std::allocator<char>::~allocator(&local_751);
  std::__cxx11::string::~string(local_730);
  std::__cxx11::string::~string(local_710);
  EncodeAndDecode(local_930,local_290);
  testing::internal::
  CmpHelperNE<bidfx_public_api::price::pixie::LoginMessage,bidfx_public_api::price::pixie::LoginMessage>
            ((internal *)local_808,"login_message","EncodeAndDecode(message1)",
             (LoginMessage *)login_message,(LoginMessage *)local_930);
  LoginMessage::~LoginMessage((LoginMessage *)local_930);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_808);
  if (!bVar1) {
    testing::Message::Message(&local_938);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_808);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/login_message_test.cpp"
               ,0x84,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_938);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_808);
  EncodeAndDecode(local_a78,local_4c0);
  testing::internal::
  CmpHelperNE<bidfx_public_api::price::pixie::LoginMessage,bidfx_public_api::price::pixie::LoginMessage>
            ((internal *)local_950,"login_message","EncodeAndDecode(message2)",
             (LoginMessage *)login_message,(LoginMessage *)local_a78);
  LoginMessage::~LoginMessage((LoginMessage *)local_a78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_950);
  if (!bVar1) {
    testing::Message::Message(&local_a80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_950);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/login_message_test.cpp"
               ,0x85,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_a80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_a80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_950);
  EncodeAndDecode(local_bc0,local_6f0);
  testing::internal::
  CmpHelperNE<bidfx_public_api::price::pixie::LoginMessage,bidfx_public_api::price::pixie::LoginMessage>
            ((internal *)local_a98,"login_message","EncodeAndDecode(message3)",
             (LoginMessage *)login_message,(LoginMessage *)local_bc0);
  LoginMessage::~LoginMessage((LoginMessage *)local_bc0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a98);
  if (!bVar1) {
    testing::Message::Message(&local_bc8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a98);
    testing::internal::AssertHelper::AssertHelper
              (&local_bd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/login_message_test.cpp"
               ,0x86,pcVar2);
    testing::internal::AssertHelper::operator=(&local_bd0,&local_bc8);
    testing::internal::AssertHelper::~AssertHelper(&local_bd0);
    testing::Message::~Message(&local_bc8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a98);
  LoginMessage::~LoginMessage(local_6f0);
  LoginMessage::~LoginMessage(local_4c0);
  LoginMessage::~LoginMessage(local_290);
  return;
}

Assistant:

TEST(LoginMessageTest, test_encode_and_decode)
{
    EXPECT_EQ(login_message, EncodeAndDecode(login_message));
    LoginMessage message1("mcandate", PASSWORD, ALIAS, APPLICATION, APPLICATION_VERSION, API, API_VERSION, PRODUCT_SERIAL_NUMBER);
    LoginMessage message2(USERNAME, "g1veMes0Mehoney", ALIAS, APPLICATION, APPLICATION_VERSION, API, API_VERSION, PRODUCT_SERIAL_NUMBER);
    LoginMessage message3(USERNAME, PASSWORD, "matteo", APPLICATION, APPLICATION_VERSION, API, API_VERSION, PRODUCT_SERIAL_NUMBER);
    EXPECT_NE(login_message, EncodeAndDecode(message1));
    EXPECT_NE(login_message, EncodeAndDecode(message2));
    EXPECT_NE(login_message, EncodeAndDecode(message3));
}